

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastBrOrCmString(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined1 isStrict;
  RegOpnd *srcReg1;
  RegOpnd *srcReg2;
  LabelInstr *labelHelper;
  undefined4 *puVar4;
  undefined7 extraout_var;
  LabelInstr *pLVar5;
  Opnd *pOVar6;
  Opnd *src;
  Instr *this_00;
  BranchInstr *pBVar7;
  uint uVar8;
  uint *puVar9;
  undefined7 uVar10;
  undefined8 uVar11;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_58;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_56;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_54;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  LabelInstr *local_50;
  LabelInstr *local_48;
  undefined8 local_40;
  uint local_38;
  uint local_34;
  
  bVar3 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (bVar3) {
    srcReg1 = IR::Opnd::AsRegOpnd(instr->m_src1);
  }
  else {
    srcReg1 = (RegOpnd *)0x0;
  }
  bVar3 = IR::Opnd::IsRegOpnd(instr->m_src2);
  if ((((!bVar3) ||
       (srcReg2 = IR::Opnd::AsRegOpnd(instr->m_src2),
       srcReg2 == (RegOpnd *)0x0 || srcReg1 == (RegOpnd *)0x0)) ||
      (bVar3 = IR::Opnd::IsTaggedInt(&srcReg1->super_Opnd), bVar3)) ||
     (bVar3 = IR::Opnd::IsTaggedInt(&srcReg2->super_Opnd), bVar3)) {
    return false;
  }
  local_58 = (srcReg1->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::HasHadStringTag((ValueType *)&local_58.field_0);
  if (!bVar3) {
    local_56 = (srcReg2->super_Opnd).m_valueType.field_0;
    bVar3 = ValueType::IsString((ValueType *)&local_56.field_0);
    if (!bVar3) {
      return false;
    }
  }
  local_54 = (srcReg2->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::HasHadStringTag((ValueType *)&local_54.field_0);
  if (!bVar3) {
    local_52 = (srcReg1->super_Opnd).m_valueType.field_0;
    bVar3 = ValueType::IsString((ValueType *)&local_52.field_0);
    if (!bVar3) {
      return false;
    }
  }
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  OVar1 = instr->m_opcode;
  uVar11 = 0;
  uVar8 = OVar1 - 0xc;
  if (uVar8 < 10) {
    puVar9 = (uint *)((long)&switchD_00571a95::switchdataD_00e79f74 +
                     (long)(int)(&switchD_00571a95::switchdataD_00e79f74)[uVar8]);
    switch((uint)OVar1) {
    default:
      goto switchD_00571a73_caseD_3c;
    case 0x14:
switchD_00571ab3_caseD_197:
      uVar11 = 1;
    case 0xc:
switchD_00571ab3_caseD_195:
      local_40 = uVar11;
      pLVar5 = IR::LabelInstr::New(Label,this->m_func,false);
      pBVar7 = IR::Instr::AsBranchInstr(instr);
      local_48 = pBVar7->m_branchTarget;
      local_50 = pLVar5;
      IR::Instr::InsertAfter(instr,&pLVar5->super_Instr);
      isStrict = (undefined1)local_40;
      uVar10 = (undefined7)((ulong)puVar9 >> 8);
      local_34 = (uint)CONCAT71(uVar10,1);
      bVar3 = true;
      local_38 = (uint)CONCAT71(uVar10,1);
      break;
    case 0x15:
switchD_00571ab3_caseD_196:
      uVar11 = 1;
    case 0xd:
switchD_00571ab3_caseD_194:
      local_38 = 0;
      local_40 = uVar11;
      pLVar5 = IR::LabelInstr::New(Label,this->m_func,false);
      pBVar7 = IR::Instr::AsBranchInstr(instr);
      local_50 = pBVar7->m_branchTarget;
      local_48 = pLVar5;
      IR::Instr::InsertAfter(instr,&pLVar5->super_Instr);
      isStrict = (undefined1)local_40;
      local_34 = (uint)CONCAT71((int7)((ulong)puVar9 >> 8),1);
      bVar3 = true;
    }
    goto LAB_00571c25;
  }
  switch(OVar1) {
  case CmEq_A:
    local_40 = 0;
    local_34 = 0xe79f01;
    break;
  case CmGe_A:
  case CmGt_A:
  case CmLt_A:
  case CmLe_A:
    goto switchD_00571a73_caseD_3c;
  case CmNeq_A:
    local_34 = 0;
    local_40 = 0;
    break;
  case CmSrEq_A:
    local_34 = 0xe79f01;
    local_40 = 0xe79f01;
    break;
  case CmSrNeq_A:
    local_40 = 0xe79f01;
    local_34 = 0;
    break;
  default:
    puVar9 = &switchD_00571ab3::switchdataD_00e79fbc;
    switch(OVar1) {
    case BrNotEq_A:
      goto switchD_00571ab3_caseD_194;
    case BrNotNeq_A:
      goto switchD_00571ab3_caseD_195;
    case BrSrNotEq_A:
      goto switchD_00571ab3_caseD_196;
    case BrSrNotNeq_A:
      goto switchD_00571ab3_caseD_197;
    }
    goto switchD_00571a73_caseD_3c;
  }
  bVar3 = false;
  local_48 = IR::LabelInstr::New(Label,this->m_func,false);
  local_50 = IR::LabelInstr::New(Label,this->m_func,false);
  local_38 = local_34;
  isStrict = (undefined1)local_40;
LAB_00571c25:
  GenerateFastStringCheck
            (this,instr,srcReg1,srcReg2,false,(bool)isStrict,labelHelper,local_48,local_50);
  pLVar5 = IR::LabelInstr::New(Label,this->m_func,false);
  if (!bVar3) {
    uVar8 = local_34 & 0xff;
    IR::Instr::InsertBefore(instr,&local_48->super_Instr);
    local_48 = (LabelInstr *)instr->m_dst;
    pOVar6 = LoadLibraryValueOpnd(this,instr,ValueFalse - uVar8);
    InsertMove((Opnd *)local_48,pOVar6,instr,true);
    InsertBranch(Br,pLVar5,instr);
    IR::Instr::InsertBefore(instr,&local_50->super_Instr);
    pOVar6 = instr->m_dst;
    src = LoadLibraryValueOpnd(this,instr,uVar8 + ValueTrue);
    InsertMove(pOVar6,src,instr,true);
    InsertBranch(Br,pLVar5,instr);
  }
  IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
  IR::Instr::InsertAfter(instr,&pLVar5->super_Instr);
  if ((char)local_38 == '\0') {
    labelHelper = (LabelInstr *)instr;
  }
  this_00 = IR::Instr::GetNextBranchOrLabel(&labelHelper->super_Instr);
  if (this_00->m_kind == InstrKindBranch) {
    pBVar7 = IR::Instr::AsBranchInstr(this_00);
    pBVar7->m_isHelperToNonHelperBranch = true;
  }
  pLVar5->field_0x78 = pLVar5->field_0x78 | 0x20;
  return true;
switchD_00571a73_caseD_3c:
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x5eec,"((0))","(0)");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
  local_34 = (uint)CONCAT71(extraout_var,1);
  isStrict = false;
  bVar3 = true;
  local_38 = 0;
  local_48 = (LabelInstr *)0x0;
  local_50 = (LabelInstr *)0x0;
  goto LAB_00571c25;
}

Assistant:

bool
Lowerer::GenerateFastBrOrCmString(IR::Instr* instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    if (!srcReg1 ||
        !srcReg2 ||
        srcReg1->IsTaggedInt() ||
        srcReg2->IsTaggedInt() ||
        (!srcReg1->GetValueType().HasHadStringTag() && !srcReg2->GetValueType().IsString()) ||
        (!srcReg2->GetValueType().HasHadStringTag() && !srcReg1->GetValueType().IsString()))
    {
        return false;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr *labelBranchFail = nullptr;
    IR::LabelInstr *labelBranchSuccess = nullptr;

    bool isEqual = false;
    bool isStrict = false;
    bool isBranch = true;
    bool isCmNegOp = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        isStrict = true;
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
        labelBranchFail = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchSuccess = instr->AsBranchInstr()->GetTarget();
        instr->InsertAfter(labelBranchFail);
        isEqual = true;
        break;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
        isStrict = true;
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchFail = instr->AsBranchInstr()->GetTarget();
        instr->InsertAfter(labelBranchSuccess);
        isEqual = false;
        break;

    case Js::OpCode::CmSrEq_A:
        isStrict = true;
    case Js::OpCode::CmEq_A:
        isEqual = true;
        isBranch = false;
        break;

    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
    case Js::OpCode::CmNeq_A:
        isEqual = false;
        isBranch = false;
        isCmNegOp = true;
        break;

    default:
        Assume(UNREACHED);
    }

    if (!isBranch)
    {
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchFail = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    }

    GenerateFastStringCheck(instr, srcReg1, srcReg2, isEqual, isStrict, labelHelper, labelBranchSuccess, labelBranchFail);

    IR::LabelInstr *labelFallthrough = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    if (!isBranch)
    {
        const LibraryValue successValueType = !isCmNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
        const LibraryValue failureValueType = !isCmNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;

        instr->InsertBefore(labelBranchSuccess);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        instr->InsertBefore(labelBranchFail);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallthrough, instr);
    }

    instr->InsertBefore(labelHelper);

    instr->InsertAfter(labelFallthrough);

#if DBG
    // The fast-path for strings assumes the case where 2 strings are equal is rare, and marks that path as 'helper'.
    // This breaks the helper label dbchecks as it can result in non-helper blocks be reachable only from helper blocks.
    // Use m_isHelperToNonHelperBranch and m_noHelperAssert to fix this.
    IR::Instr *blockEndInstr;

    if (isEqual)
    {
        blockEndInstr = labelHelper->GetNextBranchOrLabel();
    }
    else
    {
        blockEndInstr = instr->GetNextBranchOrLabel();
    }

    if (blockEndInstr->IsBranchInstr())
    {
        blockEndInstr->AsBranchInstr()->m_isHelperToNonHelperBranch = true;
    }

    labelFallthrough->m_noHelperAssert = true;
#endif

    return true;
}